

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
WSNTopologyBasedEnergy::SelectServalNode
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,WSNTopologyBasedEnergy *this)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  reference piVar4;
  _InputArray local_1a8;
  allocator<char> local_189;
  string local_188 [32];
  int *local_168;
  Scalar local_160;
  WSNNode local_140;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  int *local_100;
  _InputArray local_f8;
  allocator<char> local_d9;
  string local_d8 [32];
  int *local_b8;
  Scalar_<double> local_b0;
  WSNNode local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  int *local_50;
  int local_48;
  int i_1;
  int local_34;
  int local_30;
  int local_2c;
  int i;
  int SelectNodeNum;
  iterator it;
  WSNTopologyBasedEnergy *this_local;
  vector<int,_std::allocator<int>_> *SelectNodeSeq;
  
  it._M_current._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar2 = rand();
  local_2c = iVar2 % 9 + 1;
  for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
    local_34 = rand();
    local_34 = local_34 % 99;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_34);
  }
  for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
    _i = (iterator)local_50;
    while( true ) {
      local_58._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i,
                         &local_58);
      if (!bVar1) break;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
      WSNNode::WSNNode(&local_90,this->node + *piVar4);
      cv::Scalar_<double>::Scalar_(&local_b0,255.0,255.0,255.0,0.0);
      drawCrossNode(this,&this->img,&local_90,&local_b0);
      WSNNode::~WSNNode(&local_90);
      local_b8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)&i,0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"WSN",&local_d9);
    cv::_InputArray::_InputArray(&local_f8,&this->img);
    cv::imshow(local_d8,&local_f8);
    cv::_InputArray::~_InputArray(&local_f8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if ((this->Test & 1U) == 1) {
      cv::waitKey(0x46);
    }
    local_100 = (int *)std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
    _i = (iterator)local_100;
    while( true ) {
      local_108._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i,
                         &local_108);
      if (!bVar1) break;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
      WSNNode::WSNNode(&local_140,this->node + *piVar4);
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
      WSNNode::NodeColor(&local_160,this->node + *piVar4);
      drawCrossNode(this,&this->img,&local_140,&local_160);
      WSNNode::~WSNNode(&local_140);
      local_168 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&i,0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"WSN",&local_189);
    cv::_InputArray::_InputArray(&local_1a8,&this->img);
    cv::imshow(local_188,&local_1a8);
    cv::_InputArray::~_InputArray(&local_1a8);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    if ((this->Test & 1U) == 1) {
      cv::waitKey(0x46);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> WSNTopologyBasedEnergy::SelectServalNode()
{
	vector<int> SelectNodeSeq;
	vector<int>::iterator it;

	srand((int)time(0));
	int SelectNodeNum=rand()%9+1;
	for(int i=0;i<SelectNodeNum;i++)
	{
		SelectNodeSeq.push_back(rand()%99);
	}

	//闪烁表示发送信号
	for(int i=0;i<LayerNum;i++)
	{
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],Scalar(255,255,255));
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],node[*it].NodeColor());	
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
	}
	return SelectNodeSeq;
}